

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lyp_check_include_missing_recursive(lys_module *main_module,lys_submodule *sub)

{
  char *pcVar1;
  uint8_t uVar2;
  ly_ctx *ctx;
  lys_include *plVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  lys_include *plVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  
  if (sub->inc_size == '\0') {
    iVar12 = 0;
  }
  else {
    ctx = main_module->ctx;
    uVar11 = 0;
    iVar12 = 0;
    do {
      uVar2 = main_module->inc_size;
      if (uVar2 == '\0') {
        uVar9 = '\0';
      }
      else {
        plVar7 = main_module->inc;
        uVar8 = '\0';
        do {
          uVar9 = uVar8;
          if (plVar7->submodule == sub->inc[uVar11].submodule) break;
          uVar8 = uVar8 + '\x01';
          plVar7 = plVar7 + 1;
          uVar9 = uVar2;
        } while (uVar2 != uVar8);
      }
      if (uVar9 == uVar2) {
        if ((main_module->field_0x40 & 0xc) == 0) {
          ly_log(ctx,LY_LLWRN,LY_SUCCESS,
                 "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\"."
                 ,main_module->name,(sub->inc[uVar11].submodule)->name,sub->name);
          ly_log(ctx,LY_LLWRN,LY_SUCCESS,
                 "To avoid further issues, adding submodule \"%s\" into the main module \"%s\".",
                 (sub->inc[uVar11].submodule)->name,main_module->name);
        }
        else {
          ly_vlog(ctx,LYE_MISSSTMT,LY_VLOG_NONE,(void *)0x0,"include");
          ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                  "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\"."
                  ,main_module->name,(sub->inc[uVar11].submodule)->name,sub->name);
          iVar12 = 1;
        }
        bVar4 = main_module->inc_size + 1;
        main_module->inc_size = bVar4;
        plVar7 = (lys_include *)realloc(main_module->inc,(ulong)bVar4 * 0x30);
        if (plVar7 == (lys_include *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lyp_check_include_missing_recursive");
          return 1;
        }
        main_module->inc = plVar7;
        uVar10 = (ulong)((uint)main_module->inc_size * 0x30);
        pcVar1 = plVar7->rev + (uVar10 - 0x18);
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(undefined8 *)(pcVar1 + 8) = 0;
        pcVar1 = plVar7->rev + (uVar10 - 0x28);
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(undefined8 *)(pcVar1 + 8) = 0;
        pcVar1 = plVar7[-1].rev + (uVar10 - 8);
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(undefined8 *)(pcVar1 + 8) = 0;
        plVar3 = sub->inc;
        *(undefined2 *)(plVar7->rev + (uVar10 - 0x28)) = *(undefined2 *)(plVar3[uVar11].rev + 8);
        *(undefined8 *)(plVar7->rev + (uVar10 - 0x30)) = *(undefined8 *)plVar3[uVar11].rev;
        *(lys_submodule **)(plVar7[-1].rev + (uVar10 - 8)) = plVar3[uVar11].submodule;
      }
      iVar5 = lyp_check_include_missing_recursive(main_module,sub->inc[uVar11].submodule);
      iVar6 = iVar12;
      if (iVar5 != 0) {
        iVar6 = 1;
      }
      if (iVar12 == 0) {
        iVar12 = iVar6;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < sub->inc_size);
  }
  return iVar12;
}

Assistant:

static int
lyp_check_include_missing_recursive(struct lys_module *main_module, struct lys_submodule *sub)
{
    uint8_t i, j;
    void *reallocated;
    int ret = 0, tmp;
    struct ly_ctx *ctx = main_module->ctx;

    for (i = 0; i < sub->inc_size; i++) {
        /* check that the include is also present in the main module */
        for (j = 0; j < main_module->inc_size; j++) {
            if (main_module->inc[j].submodule == sub->inc[i].submodule) {
                break;
            }
        }

        if (j == main_module->inc_size) {
            /* match not found */
            if (main_module->version >= LYS_VERSION_1_1) {
                LOGVAL(ctx, LYE_MISSSTMT, LY_VLOG_NONE, NULL, "include");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL,
                       "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\".",
                       main_module->name, sub->inc[i].submodule->name, sub->name);
                /* now we should return error, but due to the issues with freeing the module, we actually have
                 * to go through the all includes and, as in case of 1.0, add them into the main module and fail
                 * at the end when all the includes are in the main module and we can free them */
                ret = 1;
            } else {
                /* not strictly an error in YANG 1.0 */
                LOGWRN(ctx, "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\".",
                       main_module->name, sub->inc[i].submodule->name, sub->name);
                LOGWRN(ctx, "To avoid further issues, adding submodule \"%s\" into the main module \"%s\".",
                       sub->inc[i].submodule->name, main_module->name);
                /* but since it is a good practise and because we expect all the includes in the main module
                 * when searching it and also when freeing the module, put it into it */
            }
            main_module->inc_size++;
            reallocated = realloc(main_module->inc, main_module->inc_size * sizeof *main_module->inc);
            LY_CHECK_ERR_RETURN(!reallocated, LOGMEM(ctx), 1);
            main_module->inc = reallocated;
            memset(&main_module->inc[main_module->inc_size - 1], 0, sizeof *main_module->inc);
            /* to avoid unexpected consequences, copy just a link to the submodule and the revision,
             * all other substatements of the include are ignored */
            memcpy(&main_module->inc[main_module->inc_size - 1].rev, sub->inc[i].rev, LY_REV_SIZE - 1);
            main_module->inc[main_module->inc_size - 1].submodule = sub->inc[i].submodule;
        }

        /* recursion */
        tmp = lyp_check_include_missing_recursive(main_module, sub->inc[i].submodule);
        if (!ret && tmp) {
            ret = 1;
        }
    }

    return ret;
}